

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O1

CURLcode Curl_loadhostpairs(Curl_easy *data)

{
  curl_slist *pcVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  char *pcVar5;
  ulong uVar6;
  Curl_addrinfo *pCVar7;
  void *pvVar8;
  Curl_dns_entry *pCVar9;
  uint uVar10;
  Curl_addrinfo *pCVar11;
  char *pcVar12;
  char *pcVar13;
  char *__s;
  bool bVar14;
  int port;
  char hostname [256];
  char address [64];
  uint local_1a4;
  char *local_1a0;
  char *local_198;
  Curl_easy *local_190;
  Curl_addrinfo *local_188;
  Curl_addrinfo *local_180;
  char local_178 [256];
  char local_78 [72];
  
  local_1a4 = 0;
  (data->change).wildcard_resolve = false;
  pcVar1 = (data->change).resolve;
  do {
    if (pcVar1 == (curl_slist *)0x0) {
      (data->change).resolve = (curl_slist *)0x0;
      return CURLE_OK;
    }
    pcVar3 = pcVar1->data;
    if (pcVar3 != (char *)0x0) {
      if (*pcVar3 == '-') {
        iVar2 = __isoc99_sscanf(pcVar3 + 1,"%255[^:]:%d",local_178,&local_1a4);
        if (iVar2 == 2) {
          pcVar3 = create_hostcache_id(local_178,local_1a4);
          if (pcVar3 == (char *)0x0) {
            bVar14 = true;
          }
          else {
            sVar4 = strlen(pcVar3);
            if (data->share != (Curl_share *)0x0) {
              Curl_share_lock(data,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
            }
            Curl_hash_delete((data->dns).hostcache,pcVar3,sVar4 + 1);
            if (data->share != (Curl_share *)0x0) {
              Curl_share_unlock(data,CURL_LOCK_DATA_DNS);
            }
            (*Curl_cfree)(pcVar3);
            bVar14 = false;
          }
        }
        else {
          Curl_infof(data,"Couldn\'t parse CURLOPT_RESOLVE removal entry \'%s\'!\n",pcVar1->data);
          bVar14 = false;
        }
        if (bVar14) {
          return CURLE_OUT_OF_MEMORY;
        }
      }
      else {
        pcVar3 = pcVar1->data;
        pcVar5 = strchr(pcVar3,0x3a);
        bVar14 = true;
        if ((pcVar5 == (char *)0x0) || (0xff < (long)pcVar5 - (long)pcVar3)) {
          pcVar3 = (char *)0x0;
          pCVar11 = (Curl_addrinfo *)0x0;
        }
        else {
          memcpy(local_178,pcVar3,(long)pcVar5 - (long)pcVar3);
          pcVar5[(long)(local_178 + -(long)pcVar1->data)] = '\0';
          uVar6 = strtoul(pcVar5 + 1,&local_198,10);
          if (((uVar6 < 0x10000) && (local_198 != pcVar5 + 1)) && (*local_198 == ':')) {
            local_1a4 = (uint)uVar6;
            pcVar3 = local_198 + 1;
            local_190 = data;
            if (*local_198 == '\0') {
              pcVar5 = local_198;
              pCVar11 = (Curl_addrinfo *)0x0;
            }
            else {
              pCVar7 = (Curl_addrinfo *)0x0;
              pCVar11 = (Curl_addrinfo *)0x0;
              pcVar13 = local_198;
              local_1a0 = pcVar3;
              do {
                __s = pcVar13 + 1;
                local_188 = pCVar7;
                pcVar5 = strchr(__s,0x2c);
                if (pcVar5 == (char *)0x0) {
                  sVar4 = strlen(__s);
                  pcVar5 = __s + sVar4;
                }
                pcVar12 = pcVar5;
                pCVar7 = local_188;
                if (*__s == '[') {
                  uVar10 = 5;
                  if ((pcVar5 != __s) && (pcVar5[-1] == ']')) {
                    __s = pcVar13 + 2;
                    pcVar12 = pcVar5 + -1;
                    goto LAB_0010bc7f;
                  }
                }
                else {
LAB_0010bc7f:
                  uVar6 = (long)pcVar12 - (long)__s;
                  pcVar3 = local_1a0;
                  if (uVar6 == 0) {
                    uVar10 = 6;
                  }
                  else {
                    uVar10 = 5;
                    if (uVar6 < 0x40) {
                      local_180 = pCVar11;
                      memcpy(local_78,__s,uVar6);
                      local_78[uVar6] = '\0';
                      pCVar7 = Curl_str2addr(local_78,local_1a4);
                      if (pCVar7 == (Curl_addrinfo *)0x0) {
                        Curl_infof(local_190,"Resolve address \'%s\' found illegal!\n",local_78);
                        pCVar7 = local_188;
                        pcVar3 = local_1a0;
                        pCVar11 = local_180;
                      }
                      else {
                        uVar10 = 0;
                        pcVar3 = local_1a0;
                        pCVar11 = pCVar7;
                        if (local_188 != (Curl_addrinfo *)0x0) {
                          local_188->ai_next = pCVar7;
                          pCVar11 = local_180;
                        }
                      }
                    }
                  }
                }
                local_180 = pCVar11;
                bVar14 = true;
                pCVar11 = local_180;
                if ((uVar10 != 0) && (uVar10 != 6)) {
                  data = local_190;
                  local_198 = pcVar5;
                  if (uVar10 == 5) goto LAB_0010bd59;
                  goto LAB_0010bec3;
                }
                pcVar13 = pcVar5;
              } while (*pcVar5 != '\0');
            }
            bVar14 = pCVar11 == (Curl_addrinfo *)0x0;
            data = local_190;
            local_198 = pcVar5;
          }
          else {
            pcVar3 = (char *)0x0;
            bVar14 = true;
            pCVar11 = (Curl_addrinfo *)0x0;
          }
        }
LAB_0010bd59:
        if (bVar14) {
          Curl_infof(data,"Couldn\'t parse CURLOPT_RESOLVE entry \'%s\'!\n",pcVar1->data);
          Curl_freeaddrinfo(pCVar11);
          uVar10 = 0;
        }
        else {
          local_1a0 = pcVar3;
          pcVar3 = create_hostcache_id(local_178,local_1a4);
          if (pcVar3 != (char *)0x0) {
            sVar4 = strlen(pcVar3);
            if (data->share != (Curl_share *)0x0) {
              Curl_share_lock(data,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
            }
            pvVar8 = Curl_hash_pick((data->dns).hostcache,pcVar3,sVar4 + 1);
            if (pvVar8 != (void *)0x0) {
              Curl_infof(data,"RESOLVE %s:%d is - old addresses discarded!\n",local_178,
                         (ulong)local_1a4);
              Curl_hash_delete((data->dns).hostcache,pcVar3,sVar4 + 1);
            }
            (*Curl_cfree)(pcVar3);
            pCVar9 = Curl_cache_addr(data,pCVar11,local_178,local_1a4);
            if (pCVar9 != (Curl_dns_entry *)0x0) {
              pCVar9->timestamp = 0;
              pCVar9->inuse = pCVar9->inuse + -1;
            }
            if (data->share != (Curl_share *)0x0) {
              Curl_share_unlock(data,CURL_LOCK_DATA_DNS);
            }
            if (pCVar9 != (Curl_dns_entry *)0x0) {
              uVar10 = 0;
              Curl_infof(data,"Added %s:%d:%s to DNS cache\n",local_178,(ulong)local_1a4,local_1a0);
              if ((local_178[0] == '*') && (local_178[1] == '\0')) {
                uVar10 = 0;
                Curl_infof(data,"RESOLVE %s:%d is wildcard, enabling wildcard checks\n",local_178,
                           (ulong)local_1a4);
                (data->change).wildcard_resolve = true;
              }
              goto LAB_0010bec3;
            }
          }
          Curl_freeaddrinfo(pCVar11);
          uVar10 = 1;
        }
LAB_0010bec3:
        if ((uVar10 & 3) != 0) {
          return CURLE_OUT_OF_MEMORY;
        }
      }
    }
    pcVar1 = pcVar1->next;
  } while( true );
}

Assistant:

CURLcode Curl_loadhostpairs(struct Curl_easy *data)
{
  struct curl_slist *hostp;
  char hostname[256];
  int port = 0;

  /* Default is no wildcard found */
  data->change.wildcard_resolve = false;

  for(hostp = data->change.resolve; hostp; hostp = hostp->next) {
    if(!hostp->data)
      continue;
    if(hostp->data[0] == '-') {
      char *entry_id;
      size_t entry_len;

      if(2 != sscanf(hostp->data + 1, "%255[^:]:%d", hostname, &port)) {
        infof(data, "Couldn't parse CURLOPT_RESOLVE removal entry '%s'!\n",
              hostp->data);
        continue;
      }

      /* Create an entry id, based upon the hostname and port */
      entry_id = create_hostcache_id(hostname, port);
      /* If we can't create the entry id, fail */
      if(!entry_id) {
        return CURLE_OUT_OF_MEMORY;
      }

      entry_len = strlen(entry_id);

      if(data->share)
        Curl_share_lock(data, CURL_LOCK_DATA_DNS, CURL_LOCK_ACCESS_SINGLE);

      /* delete entry, ignore if it didn't exist */
      Curl_hash_delete(data->dns.hostcache, entry_id, entry_len + 1);

      if(data->share)
        Curl_share_unlock(data, CURL_LOCK_DATA_DNS);

      /* free the allocated entry_id again */
      free(entry_id);
    }
    else {
      struct Curl_dns_entry *dns;
      Curl_addrinfo *head = NULL, *tail = NULL;
      char *entry_id;
      size_t entry_len;
      char address[64];
#if !defined(CURL_DISABLE_VERBOSE_STRINGS)
      char *addresses = NULL;
#endif
      char *addr_begin;
      char *addr_end;
      char *port_ptr;
      char *end_ptr;
      char *host_end;
      unsigned long tmp_port;
      bool error = true;

      host_end = strchr(hostp->data, ':');
      if(!host_end ||
         ((host_end - hostp->data) >= (ptrdiff_t)sizeof(hostname)))
        goto err;

      memcpy(hostname, hostp->data, host_end - hostp->data);
      hostname[host_end - hostp->data] = '\0';

      port_ptr = host_end + 1;
      tmp_port = strtoul(port_ptr, &end_ptr, 10);
      if(tmp_port > USHRT_MAX || end_ptr == port_ptr || *end_ptr != ':')
        goto err;

      port = (int)tmp_port;
#if !defined(CURL_DISABLE_VERBOSE_STRINGS)
      addresses = end_ptr + 1;
#endif

      while(*end_ptr) {
        size_t alen;
        Curl_addrinfo *ai;

        addr_begin = end_ptr + 1;
        addr_end = strchr(addr_begin, ',');
        if(!addr_end)
          addr_end = addr_begin + strlen(addr_begin);
        end_ptr = addr_end;

        /* allow IP(v6) address within [brackets] */
        if(*addr_begin == '[') {
          if(addr_end == addr_begin || *(addr_end - 1) != ']')
            goto err;
          ++addr_begin;
          --addr_end;
        }

        alen = addr_end - addr_begin;
        if(!alen)
          continue;

        if(alen >= sizeof(address))
          goto err;

        memcpy(address, addr_begin, alen);
        address[alen] = '\0';

#ifndef ENABLE_IPV6
        if(strchr(address, ':')) {
          infof(data, "Ignoring resolve address '%s', missing IPv6 support.\n",
                address);
          continue;
        }
#endif

        ai = Curl_str2addr(address, port);
        if(!ai) {
          infof(data, "Resolve address '%s' found illegal!\n", address);
          goto err;
        }

        if(tail) {
          tail->ai_next = ai;
          tail = tail->ai_next;
        }
        else {
          head = tail = ai;
        }
      }

      if(!head)
        goto err;

      error = false;
   err:
      if(error) {
        infof(data, "Couldn't parse CURLOPT_RESOLVE entry '%s'!\n",
              hostp->data);
        Curl_freeaddrinfo(head);
        continue;
      }

      /* Create an entry id, based upon the hostname and port */
      entry_id = create_hostcache_id(hostname, port);
      /* If we can't create the entry id, fail */
      if(!entry_id) {
        Curl_freeaddrinfo(head);
        return CURLE_OUT_OF_MEMORY;
      }
      entry_len = strlen(entry_id);

      if(data->share)
        Curl_share_lock(data, CURL_LOCK_DATA_DNS, CURL_LOCK_ACCESS_SINGLE);

      /* See if its already in our dns cache */
      dns = Curl_hash_pick(data->dns.hostcache, entry_id, entry_len + 1);

      if(dns) {
        infof(data, "RESOLVE %s:%d is - old addresses discarded!\n",
                hostname, port);
        /* delete old entry entry, there are two reasons for this
         1. old entry may have different addresses.
         2. even if entry with correct addresses is already in the cache,
            but if it is close to expire, then by the time next http
            request is made, it can get expired and pruned because old
            entry is not necessarily marked as added by CURLOPT_RESOLVE. */

        Curl_hash_delete(data->dns.hostcache, entry_id, entry_len + 1);
      }
      /* free the allocated entry_id again */
      free(entry_id);

      /* put this new host in the cache */
      dns = Curl_cache_addr(data, head, hostname, port);
      if(dns) {
        dns->timestamp = 0; /* mark as added by CURLOPT_RESOLVE */
        /* release the returned reference; the cache itself will keep the
         * entry alive: */
            dns->inuse--;
      }

      if(data->share)
        Curl_share_unlock(data, CURL_LOCK_DATA_DNS);

      if(!dns) {
        Curl_freeaddrinfo(head);
        return CURLE_OUT_OF_MEMORY;
      }
      infof(data, "Added %s:%d:%s to DNS cache\n",
            hostname, port, addresses);

      /* Wildcard hostname */
      if(hostname[0] == '*' && hostname[1] == '\0') {
        infof(data, "RESOLVE %s:%d is wildcard, enabling wildcard checks\n",
              hostname, port);
        data->change.wildcard_resolve = true;
      }
    }
  }
  data->change.resolve = NULL; /* dealt with now */

  return CURLE_OK;
}